

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

Property * __thiscall camp::Class::property(Class *this,string *name)

{
  iterator iVar1;
  PropertyNotFound *__return_storage_ptr__;
  string local_b0;
  string local_90;
  PropertyNotFound local_70;
  
  iVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,std::less<std::__cxx11::string_const>,boost::multi_index::detail::nth_layer<2,std::shared_ptr<camp::Property>,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::shared_ptr<camp::Property>>>,boost::mpl::v_item<camp::Class::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,std::less<std::__cxx11::string_const>,boost::multi_index::detail::nth_layer<2,std::shared_ptr<camp::Property>,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::const_mem_fun<camp::Property,std::__cxx11::string_const&,&(camp::Property::name()const)>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::shared_ptr<camp::Property>>>,boost::mpl::v_item<camp::Class::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)&(this->m_properties).super_type,name);
  if ((random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>
       *)iVar1.node !=
      (this->m_properties).
      super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>_>_*,_boost::multi_index::multi_index_container<std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>_>
      .member) {
    return (Property *)
           ((iVar1.node)->
           super_index_node_base<std::shared_ptr<camp::Property>,_std::allocator<std::shared_ptr<camp::Property>_>_>
           ).super_pod_value_holder<std::shared_ptr<camp::Property>_>.space.data_.align_;
  }
  __return_storage_ptr__ = (PropertyNotFound *)__cxa_allocate_exception(0x48);
  PropertyNotFound::PropertyNotFound(&local_70,name,&this->m_name);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"const Property &camp::Class::property(const std::string &) const",
             "");
  Error::prepare<camp::PropertyNotFound>(__return_storage_ptr__,&local_70,&local_b0,0x80,&local_90);
  __cxa_throw(__return_storage_ptr__,&PropertyNotFound::typeinfo,Error::~Error);
}

Assistant:

const Property& Class::property(const std::string& name) const
{
    const PropertyNameIndex& names = m_properties.get<Name>();

    PropertyNameIndex::const_iterator it = names.find(name);
    if (it == names.end())
        CAMP_ERROR(PropertyNotFound(name, m_name));

    return **it;
}